

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3PoslistMerge(char **pp,char **pp1,char **pp2)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  uchar *q;
  byte *__dest;
  byte *pbVar8;
  byte *pBuf;
  byte *pBuf_00;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  size_t sVar13;
  sqlite3_int64 iVal;
  int iCol2;
  int iCol1;
  long local_58;
  int local_50;
  int local_4c;
  char **local_48;
  char **local_40;
  char **local_38;
  
  __dest = (byte *)*pp;
  pBuf_00 = (byte *)*pp1;
  pBuf = (byte *)*pp2;
  local_48 = pp;
  local_40 = pp1;
  local_38 = pp2;
  do {
    if (*pBuf_00 == 0) {
      if (*pBuf == 0) {
        *__dest = 0;
        *local_48 = (char *)(__dest + 1);
        *local_40 = (char *)(pBuf_00 + 1);
        *local_38 = (char *)(pBuf + 1);
        return 0;
      }
      local_4c = 0x7fffffff;
    }
    else if (*pBuf_00 == 1) {
      iVar5 = (int)(char)pBuf_00[1];
      if ((char)pBuf_00[1] < '\0') {
        sqlite3Fts3GetVarint32((char *)(pBuf_00 + 1),&local_4c);
        iVar5 = local_4c;
      }
      local_4c = iVar5;
      if (local_4c == 0) {
        return 0x10b;
      }
    }
    else {
      local_4c = 0;
    }
    iVar5 = local_4c;
    if (*pBuf == 0) {
      local_50 = 0x7fffffff;
    }
    else if (*pBuf == 1) {
      iVar4 = (int)(char)pBuf[1];
      if ((char)pBuf[1] < '\0') {
        sqlite3Fts3GetVarint32((char *)(pBuf + 1),&local_50);
        iVar4 = local_50;
      }
      local_50 = iVar4;
      if (local_50 == 0) {
        return 0x10b;
      }
    }
    else {
      local_50 = 0;
    }
    if (iVar5 == local_50) {
      if (iVar5 == 0) {
        lVar6 = 0;
      }
      else {
        lVar6 = 1;
        uVar7 = (long)iVar5;
        do {
          lVar12 = lVar6;
          bVar1 = (byte)uVar7;
          __dest[lVar12] = bVar1 | 0x80;
          lVar6 = lVar12 + 1;
          bVar2 = 0x7f < uVar7;
          uVar7 = uVar7 >> 7;
        } while (bVar2);
        __dest[lVar12] = bVar1;
        *__dest = 1;
        __dest = __dest + lVar6;
      }
      iVar5 = sqlite3Fts3GetVarint((char *)(pBuf_00 + lVar6),&local_58);
      lVar12 = local_58;
      pBuf_00 = pBuf_00 + lVar6 + iVar5;
      iVar5 = sqlite3Fts3GetVarint((char *)(pBuf + lVar6),&local_58);
      pBuf = pBuf + lVar6 + iVar5;
      lVar11 = 0;
      lVar6 = local_58;
      do {
        lVar10 = lVar6;
        if (lVar12 < lVar6) {
          lVar10 = lVar12;
        }
        uVar7 = lVar10 - lVar11;
        do {
          pbVar8 = __dest;
          bVar1 = (byte)uVar7;
          *pbVar8 = bVar1 | 0x80;
          __dest = pbVar8 + 1;
          bVar2 = 0x7f < uVar7;
          uVar7 = uVar7 >> 7;
        } while (bVar2);
        *pbVar8 = bVar1;
        if (lVar12 == lVar6) {
          lVar6 = 0x7fffffff;
          if (*pBuf_00 < 2) {
            lVar9 = 0x7fffffff;
          }
          else {
            iVar5 = sqlite3Fts3GetVarint((char *)pBuf_00,&local_58);
            pBuf_00 = pBuf_00 + iVar5;
            lVar9 = lVar12 + local_58 + -2;
          }
          if (1 < *pBuf) {
            iVar5 = sqlite3Fts3GetVarint((char *)pBuf,&local_58);
            pBuf = pBuf + iVar5;
            lVar6 = lVar12 + local_58 + -2;
          }
        }
        else if (lVar12 < lVar6) {
          if (*pBuf_00 < 2) {
            lVar9 = 0x7fffffff;
          }
          else {
            iVar5 = sqlite3Fts3GetVarint((char *)pBuf_00,&local_58);
            pBuf_00 = pBuf_00 + iVar5;
            lVar9 = lVar12 + local_58 + -2;
          }
        }
        else {
          lVar9 = lVar12;
          if (*pBuf < 2) {
            lVar6 = 0x7fffffff;
          }
          else {
            iVar5 = sqlite3Fts3GetVarint((char *)pBuf,&local_58);
            pBuf = pBuf + iVar5;
            lVar6 = lVar6 + local_58 + -2;
          }
        }
        lVar11 = lVar10 + -2;
        lVar12 = lVar9;
      } while ((lVar9 != 0x7fffffff) || (lVar6 != 0x7fffffff));
    }
    else if (iVar5 < local_50) {
      if (iVar5 == 0) {
        lVar6 = 0;
      }
      else {
        lVar6 = 1;
        uVar7 = (long)iVar5;
        do {
          lVar12 = lVar6;
          bVar1 = (byte)uVar7;
          __dest[lVar12] = bVar1 | 0x80;
          lVar6 = lVar12 + 1;
          bVar2 = 0x7f < uVar7;
          uVar7 = uVar7 >> 7;
        } while (bVar2);
        __dest[lVar12] = bVar1;
        *__dest = 1;
        __dest = __dest + lVar6;
      }
      pbVar8 = pBuf_00 + lVar6;
      bVar1 = pBuf_00[lVar6];
      pBuf_00 = pbVar8;
      if (1 < bVar1) {
        do {
          bVar3 = bVar1 & 0x80;
          bVar1 = pBuf_00[1];
          pBuf_00 = pBuf_00 + 1;
        } while ((bVar1 & 0xfe) != 0 || bVar3 != 0);
      }
      sVar13 = (size_t)((int)pBuf_00 - (int)pbVar8);
      memcpy(__dest,pbVar8,sVar13);
      __dest = __dest + sVar13;
    }
    else {
      if (local_50 == 0) {
        lVar6 = 0;
      }
      else {
        lVar6 = 1;
        uVar7 = (long)local_50;
        do {
          lVar12 = lVar6;
          bVar1 = (byte)uVar7;
          __dest[lVar12] = bVar1 | 0x80;
          lVar6 = lVar12 + 1;
          bVar2 = 0x7f < uVar7;
          uVar7 = uVar7 >> 7;
        } while (bVar2);
        __dest[lVar12] = bVar1;
        *__dest = 1;
        __dest = __dest + lVar6;
      }
      pbVar8 = pBuf + lVar6;
      bVar1 = pBuf[lVar6];
      pBuf = pbVar8;
      if (1 < bVar1) {
        do {
          bVar3 = bVar1 & 0x80;
          bVar1 = pBuf[1];
          pBuf = pBuf + 1;
        } while ((bVar1 & 0xfe) != 0 || bVar3 != 0);
      }
      sVar13 = (size_t)((int)pBuf - (int)pbVar8);
      memcpy(__dest,pbVar8,sVar13);
      __dest = __dest + sVar13;
    }
  } while( true );
}

Assistant:

static int fts3PoslistMerge(
  char **pp,                      /* Output buffer */
  char **pp1,                     /* Left input list */
  char **pp2                      /* Right input list */
){
  char *p = *pp;
  char *p1 = *pp1;
  char *p2 = *pp2;

  while( *p1 || *p2 ){
    int iCol1;         /* The current column index in pp1 */
    int iCol2;         /* The current column index in pp2 */

    if( *p1==POS_COLUMN ){ 
      fts3GetVarint32(&p1[1], &iCol1);
      if( iCol1==0 ) return FTS_CORRUPT_VTAB;
    }
    else if( *p1==POS_END ) iCol1 = POSITION_LIST_END;
    else iCol1 = 0;

    if( *p2==POS_COLUMN ){
      fts3GetVarint32(&p2[1], &iCol2);
      if( iCol2==0 ) return FTS_CORRUPT_VTAB;
    }
    else if( *p2==POS_END ) iCol2 = POSITION_LIST_END;
    else iCol2 = 0;

    if( iCol1==iCol2 ){
      sqlite3_int64 i1 = 0;       /* Last position from pp1 */
      sqlite3_int64 i2 = 0;       /* Last position from pp2 */
      sqlite3_int64 iPrev = 0;
      int n = fts3PutColNumber(&p, iCol1);
      p1 += n;
      p2 += n;

      /* At this point, both p1 and p2 point to the start of column-lists
      ** for the same column (the column with index iCol1 and iCol2).
      ** A column-list is a list of non-negative delta-encoded varints, each 
      ** incremented by 2 before being stored. Each list is terminated by a
      ** POS_END (0) or POS_COLUMN (1). The following block merges the two lists
      ** and writes the results to buffer p. p is left pointing to the byte
      ** after the list written. No terminator (POS_END or POS_COLUMN) is
      ** written to the output.
      */
      fts3GetDeltaVarint(&p1, &i1);
      fts3GetDeltaVarint(&p2, &i2);
      do {
        fts3PutDeltaVarint(&p, &iPrev, (i1<i2) ? i1 : i2); 
        iPrev -= 2;
        if( i1==i2 ){
          fts3ReadNextPos(&p1, &i1);
          fts3ReadNextPos(&p2, &i2);
        }else if( i1<i2 ){
          fts3ReadNextPos(&p1, &i1);
        }else{
          fts3ReadNextPos(&p2, &i2);
        }
      }while( i1!=POSITION_LIST_END || i2!=POSITION_LIST_END );
    }else if( iCol1<iCol2 ){
      p1 += fts3PutColNumber(&p, iCol1);
      fts3ColumnlistCopy(&p, &p1);
    }else{
      p2 += fts3PutColNumber(&p, iCol2);
      fts3ColumnlistCopy(&p, &p2);
    }
  }

  *p++ = POS_END;
  *pp = p;
  *pp1 = p1 + 1;
  *pp2 = p2 + 1;
  return SQLITE_OK;
}